

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

char * get_token_to_eol(char *buf,char *buf_end,char **token,size_t *token_len,int *ret)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar2 = (byte *)buf;
  while (7 < (long)buf_end - (long)pbVar2) {
    bVar1 = *pbVar2;
    if (bVar1 - 0x7f < 0xffffffa1) {
LAB_00108291:
      if ((bVar1 < 0x20) && (bVar1 != 9)) goto LAB_001082cd;
      if (bVar1 == 0x7f) goto LAB_0010830f;
      pbVar2 = pbVar2 + 1;
    }
    else {
      bVar1 = pbVar2[1];
      if (bVar1 - 0x7f < 0xffffffa1) {
        pbVar2 = pbVar2 + 1;
        goto LAB_00108291;
      }
      bVar1 = pbVar2[2];
      if (bVar1 - 0x7f < 0xffffffa1) {
        pbVar2 = pbVar2 + 2;
        goto LAB_00108291;
      }
      bVar1 = pbVar2[3];
      if (bVar1 - 0x7f < 0xffffffa1) {
        pbVar2 = pbVar2 + 3;
        goto LAB_00108291;
      }
      bVar1 = pbVar2[4];
      if (bVar1 - 0x7f < 0xffffffa1) {
        pbVar2 = pbVar2 + 4;
        goto LAB_00108291;
      }
      bVar1 = pbVar2[5];
      if (bVar1 - 0x7f < 0xffffffa1) {
        pbVar2 = pbVar2 + 5;
        goto LAB_00108291;
      }
      bVar1 = pbVar2[6];
      if (bVar1 - 0x7f < 0xffffffa1) {
        pbVar2 = pbVar2 + 6;
        goto LAB_00108291;
      }
      bVar1 = pbVar2[7];
      if (bVar1 - 0x7f < 0xffffffa1) {
        pbVar2 = pbVar2 + 7;
        goto LAB_00108291;
      }
      pbVar2 = pbVar2 + 8;
    }
  }
  for (; pbVar2 != (byte *)buf_end; pbVar2 = pbVar2 + 1) {
    bVar1 = *pbVar2;
    if (bVar1 - 0x7f < 0xffffffa1) {
      if ((bVar1 < 0x20) && (bVar1 != 9)) goto LAB_001082cd;
      if (bVar1 == 0x7f) goto LAB_0010830f;
    }
  }
LAB_001082ed:
  *ret = -2;
  return (char *)0x0;
LAB_001082cd:
  if (bVar1 == 0xd) {
    if (pbVar2 + 1 == (byte *)buf_end) goto LAB_001082ed;
    if (pbVar2[1] == 10) {
      pbVar3 = pbVar2 + 2;
      *token_len = (long)pbVar2 - (long)buf;
      goto LAB_001082e9;
    }
  }
  else if (bVar1 == 10) {
    *token_len = (long)pbVar2 - (long)buf;
    pbVar3 = pbVar2 + 1;
LAB_001082e9:
    *token = buf;
    return (char *)pbVar3;
  }
LAB_0010830f:
  *ret = -1;
  return (char *)0x0;
}

Assistant:

static const char *get_token_to_eol(const char *buf, const char *buf_end, const char **token, size_t *token_len, int *ret)
{
    const char *token_start = buf;

#ifdef __SSE4_2__
    static const char ALIGNED(16) ranges1[16] = "\0\010"    /* allow HT */
                                                "\012\037"  /* allow SP and up to but not including DEL */
                                                "\177\177"; /* allow chars w. MSB set */
    int found;
    buf = findchar_fast(buf, buf_end, ranges1, 6, &found);
    if (found)
        goto FOUND_CTL;
#else
    /* find non-printable char within the next 8 bytes, this is the hottest code; manually inlined */
    while (likely(buf_end - buf >= 8)) {
#define DOIT()                                                                                                                     \
    do {                                                                                                                           \
        if (unlikely(!IS_PRINTABLE_ASCII(*buf)))                                                                                   \
            goto NonPrintable;                                                                                                     \
        ++buf;                                                                                                                     \
    } while (0)
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
        DOIT();
#undef DOIT
        continue;
    NonPrintable:
        if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) || unlikely(*buf == '\177')) {
            goto FOUND_CTL;
        }
        ++buf;
    }
#endif
    for (;; ++buf) {
        CHECK_EOF();
        if (unlikely(!IS_PRINTABLE_ASCII(*buf))) {
            if ((likely((unsigned char)*buf < '\040') && likely(*buf != '\011')) || unlikely(*buf == '\177')) {
                goto FOUND_CTL;
            }
        }
    }
FOUND_CTL:
    if (likely(*buf == '\015')) {
        ++buf;
        EXPECT_CHAR('\012');
        *token_len = buf - 2 - token_start;
    } else if (*buf == '\012') {
        *token_len = buf - token_start;
        ++buf;
    } else {
        *ret = -1;
        return NULL;
    }
    *token = token_start;

    return buf;
}